

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O2

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b_2;
  int64_t eval_b_3;
  uv_buf_t local_230;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_write_t write_req;
  uv_tcp_t conn;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_b_2 = (int64_t)iVar1;
  write_req.data = (void *)0x0;
  conn.data = (void *)eval_b_2;
  if ((void *)eval_b_2 == (void *)0x0) {
    local_230 = uv_buf_init("TEST",4);
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&conn);
    eval_b_2 = (int64_t)iVar1;
    connect_req.data = (void *)0x0;
    write_req.data = (void *)eval_b_2;
    if ((void *)eval_b_2 == (void *)0x0) {
      iVar1 = uv_write(&write_req,(uv_stream_t *)&conn,&local_230,1,write_cb);
      eval_b_2 = (int64_t)iVar1;
      connect_req.data = (void *)eval_b_2;
      if ((void *)eval_b_2 == (void *)0xfffffffffffffff7) {
        iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&addr,connect_cb);
        eval_b_2 = (int64_t)iVar1;
        eval_b_3 = 0;
        if ((void *)eval_b_2 == (void *)0x0) {
          iVar1 = uv_write(&write_req,(uv_stream_t *)&conn,&local_230,1,write_cb);
          eval_b_2 = (int64_t)iVar1;
          eval_b_3 = 0;
          if ((void *)eval_b_2 == (void *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            eval_b_2 = (int64_t)iVar1;
            eval_b_3 = 0;
            if ((void *)eval_b_2 == (void *)0x0) {
              eval_b_2 = 1;
              eval_b_3 = (int64_t)connect_cb_called;
              if (eval_b_3 == 1) {
                eval_b_2 = 1;
                eval_b_3 = (int64_t)write_cb_called;
                if (eval_b_3 == 1) {
                  eval_b_2 = 1;
                  eval_b_3 = (int64_t)close_cb_called;
                  if (eval_b_3 == 1) {
                    puVar2 = uv_default_loop();
                    uv_walk(puVar2,close_walk_cb,(void *)0x0);
                    uv_run(puVar2,UV_RUN_DEFAULT);
                    eval_b_2 = 0;
                    puVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(puVar2);
                    eval_b_3 = (int64_t)iVar1;
                    if (eval_b_3 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar4 = "uv_loop_close(uv_default_loop())";
                    pcVar3 = "0";
                    uVar5 = 0x5f;
                  }
                  else {
                    pcVar4 = "close_cb_called";
                    pcVar3 = "1";
                    uVar5 = 0x5d;
                  }
                }
                else {
                  pcVar4 = "write_cb_called";
                  pcVar3 = "1";
                  uVar5 = 0x5c;
                }
              }
              else {
                pcVar4 = "connect_cb_called";
                pcVar3 = "1";
                uVar5 = 0x5b;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar5 = 0x59;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar5 = 0x56;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x53;
        }
      }
      else {
        pcVar4 = "UV_EBADF";
        pcVar3 = "r";
        uVar5 = 0x4d;
        eval_b_3 = -9;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x4a;
      eval_b_3 = 0;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar5 = 0x46;
    eval_b_3 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b_2,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
#ifdef _WIN32
  RETURN_SKIP("This test is disabled on Windows for now. "
              "See https://github.com/joyent/libuv/issues/444\n");
#else

  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}